

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

void httplib::default_socket_options(socket_t sock)

{
  undefined1 local_4 [4];
  
  setsockopt(sock,1,0xf,local_4,4);
  return;
}

Assistant:

inline void default_socket_options(socket_t sock) {
  detail::set_socket_opt(sock, SOL_SOCKET,
#ifdef SO_REUSEPORT
                         SO_REUSEPORT,
#else
                         SO_REUSEADDR,
#endif
                         1);
}